

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAT2FO.cpp
# Opt level: O0

void __thiscall SAT::SAT2FO::collectAssignment(SAT2FO *this,SATSolver *solver,LiteralStack *res)

{
  uint uVar1;
  anon_union_4_2_6ac8864f_for_SATLiteral_0 sl_00;
  long *in_RSI;
  Stack<Kernel::Literal_*> *in_RDI;
  Literal *lit;
  SATLiteral sl;
  VarAssignment asgn;
  uint i;
  uint maxVar;
  Literal *in_stack_ffffffffffffffb8;
  SAT2FO *in_stack_ffffffffffffffd0;
  SATLiteral local_28;
  uint local_20;
  
  uVar1 = maxSATVar((SAT2FO *)0xaa2412);
  for (local_20 = 1; local_20 <= uVar1; local_20 = local_20 + 1) {
    sl_00._content = (**(code **)(*in_RSI + 0x30))(in_RSI,local_20);
    if (sl_00._content != 2) {
      SATLiteral::SATLiteral(&local_28,local_20,(uint)(sl_00._content == 0));
      in_stack_ffffffffffffffd0 = (SAT2FO *)toFO(in_stack_ffffffffffffffd0,(SATLiteral)sl_00);
      if (in_stack_ffffffffffffffd0 != (SAT2FO *)0x0) {
        Lib::Stack<Kernel::Literal_*>::push(in_RDI,in_stack_ffffffffffffffb8);
      }
    }
  }
  return;
}

Assistant:

void SAT2FO::collectAssignment(SATSolver& solver, LiteralStack& res) const
{
  // ASS_EQ(solver.getStatus(), SATSolver::SATISFIABLE);
  ASS(res.isEmpty());

  unsigned maxVar = maxSATVar();
  for (unsigned i = 1; i <= maxVar; i++) {
    SATSolver::VarAssignment asgn = solver.getAssignment(i);
    if(asgn==SATSolver::VarAssignment::DONT_CARE) {
      //we don't add DONT_CARE literals into the assignment
      continue;
    }
    ASS(asgn==SATSolver::VarAssignment::TRUE || asgn==SATSolver::VarAssignment::FALSE);
    SATLiteral sl(i, asgn==SATSolver::VarAssignment::TRUE);
    ASS(solver.trueInAssignment(sl));
    Literal* lit = toFO(sl);
    if(!lit) {
      //SAT literal doesn't have corresponding FO one
      continue;
    }
    res.push(lit);
  }
}